

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O0

bool __thiscall SendReceiver::uploadFile(SendReceiver *this,char *pathToFile)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  _Ios_Openmode _Var1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  undefined8 uVar6;
  ifstream *_in;
  string local_3a0;
  undefined1 local_380 [8];
  SendReceiver handler;
  curl_slist *headerlist;
  curl_httppost *lastptr;
  curl_httppost *formpost;
  long lStack_310;
  CURLcode res;
  CURL *curl;
  Helpers local_2e8 [8];
  ifstream in;
  path local_d0;
  path local_a8;
  undefined1 local_80 [8];
  string filename;
  string contents;
  string data;
  char *pathToFile_local;
  SendReceiver *this_local;
  
  data.field_2._8_8_ = pathToFile;
  std::__cxx11::string::string((string *)(contents.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8));
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_d0,(char **)((long)&data.field_2 + 8),auto_format);
  std::filesystem::__cxx11::path::filename(&local_a8,&local_d0);
  std::filesystem::__cxx11::path::string((string *)local_80,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path(&local_d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"pathToFile is: ");
  poVar2 = std::operator<<(poVar2,(char *)data.field_2._8_8_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  uVar6 = data.field_2._8_8_;
  _Var1 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_2e8,(char *)uVar6,_Var1);
  Helpers::readFromFile_abi_cxx11_((string *)&curl,local_2e8,_in);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&filename.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&curl);
  std::__cxx11::string::~string((string *)&curl);
  lastptr = (curl_httppost *)0x0;
  headerlist = (curl_slist *)0x0;
  curl_global_init(3);
  curl_formadd(&lastptr,&headerlist,1,"cache-control:",4,"no-cache",0x11);
  curl_formadd(&lastptr,&headerlist,1,"content-type:",4,"multipart/form-data",0x11);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80)
  ;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&filename.field_2 + 8);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (this_00);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (this_00);
  curl_formadd(&lastptr,&headerlist,1,"file",0xb,pcVar3,0xc,pcVar4,0xd,sVar5,0x11);
  lStack_310 = curl_easy_init();
  uVar6 = curl_slist_append(0,"pragma:");
  if (lStack_310 != 0) {
    curl_easy_setopt(lStack_310,0x2712,"https://api.anonfiles.com/upload");
    curl_easy_setopt(lStack_310,0x4e2b,writeCallback);
    curl_easy_setopt(lStack_310,0x2711,(undefined1 *)((long)&contents.field_2 + 8));
    curl_easy_setopt(lStack_310,0x2728,lastptr);
    formpost._4_4_ = curl_easy_perform(lStack_310);
    if (formpost._4_4_ != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error, check your internet connection [");
      pcVar3 = (char *)curl_easy_strerror(formpost._4_4_);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,"]\n");
      this_local._7_1_ = false;
      handler.super_JHandler._68_4_ = 1;
      goto LAB_0010c2d5;
    }
    curl_easy_cleanup(lStack_310);
    curl_formfree(lastptr);
    curl_slist_free_all(uVar6);
  }
  curl_global_cleanup();
  std::__cxx11::string::string
            ((string *)&local_3a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&contents.field_2 + 8));
  SendReceiver((SendReceiver *)local_380,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  printRequestData((SendReceiver *)local_380);
  this_local._7_1_ = (bool)((this->super_JHandler).status & 1);
  handler.super_JHandler._68_4_ = 1;
  ~SendReceiver((SendReceiver *)local_380);
LAB_0010c2d5:
  std::ifstream::~ifstream(local_2e8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(contents.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool SendReceiver::uploadFile(char* pathToFile) {
  std::string data, contents;
  auto filename = fs::path(pathToFile).filename().string();

  std::cout << "pathToFile is: " << pathToFile << std::endl;

  std::ifstream in(pathToFile, std::ios::in | std::ios::binary);

  contents = Helpers::readFromFile(in);

  CURL* curl;
  CURLcode res;

  struct curl_httppost* formpost = nullptr;
  struct curl_httppost* lastptr = nullptr;
  struct curl_slist* headerlist = nullptr;

  curl_global_init(CURL_GLOBAL_ALL);

// set up the header
  curl_formadd(&formpost,
               &lastptr,
               CURLFORM_COPYNAME, "cache-control:",
               CURLFORM_COPYCONTENTS, "no-cache",
               CURLFORM_END);

  curl_formadd(&formpost,
               &lastptr,
               CURLFORM_COPYNAME, "content-type:",
               CURLFORM_COPYCONTENTS, "multipart/form-data",
               CURLFORM_END);

  curl_formadd(&formpost, &lastptr,
               CURLFORM_COPYNAME, "file",  // the (in this case) wanted file-Tag!
               CURLFORM_BUFFER, filename.c_str(),
               CURLFORM_BUFFERPTR, contents.data(),
               CURLFORM_BUFFERLENGTH, contents.size(),
               CURLFORM_END);

  curl = curl_easy_init();
  headerlist = curl_slist_append(headerlist, "pragma:");
  if (curl) {
    curl_easy_setopt(curl, CURLOPT_URL, Anonfiles::Upload);

#ifndef LINUX
    curl_easy_setopt(curl, CURLOPT_SSLCERTTYPE, "PEM");
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1L);
    curl_easy_setopt(curl, CURLOPT_CAINFO, NULL);
    curl_easy_setopt(curl, CURLOPT_CAPATH, NULL);
    curl_easy_setopt(curl, CURLOPT_FRESH_CONNECT, 1L);
    curl_easy_setopt(curl, CURLOPT_SSL_CTX_FUNCTION, *sslctx_function); // set void* and load cacert.pem from memory
#endif

    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &data);
    curl_easy_setopt(curl, CURLOPT_HTTPPOST, formpost);

    res = curl_easy_perform(curl);

    /* Check for errors */
    if (res != CURLE_OK) {
      std::cerr << "Error, check your internet connection [" << curl_easy_strerror(res) << "]\n";
      return false;
    }

#ifdef DEBUG
    std::cout << std::endl << "[DEBUG|DATA] : " << data << std::endl;
#endif

    curl_easy_cleanup(curl);
    curl_formfree(formpost);
    curl_slist_free_all(headerlist);
  }
  curl_global_cleanup();

  SendReceiver handler(data);
  handler.printRequestData();
  return status;
}